

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reversed_tests.cpp
# Opt level: O3

void __thiscall
omp_reversed_const_reference_case_Test::~omp_reversed_const_reference_case_Test
          (omp_reversed_const_reference_case_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(omp_reversed, const_reference_case) {
  const std::vector values = {1, 4, 3, 2, 5};

  auto reversed_values = omp::reversed(values);

  std::vector expecting = {5, 2, 3, 4, 1};

  ASSERT_TRUE(std::equal(std::cbegin(reversed_values),
                         std::cend(reversed_values), std::cbegin(expecting),
                         std::cend(expecting)));
}